

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O1

void putSampleLE(void *sampleBuffer,int sampleIx,FILE *outputFile,
                OUTPUT_SAMPLE_FORMAT outputSampleFormat)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  float fVar6;
  int local_1c;
  
  if (outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
    fVar6 = *(float *)((long)sampleBuffer + (long)sampleIx * 4);
    uVar3 = 0;
    if ((fVar6 != 0.0) && (dVar5 = (double)fVar6, uVar3 = 0, ABS(dVar5) <= 3.4028234663852886e+38))
    {
      dVar5 = frexp(dVar5,&local_1c);
      iVar1 = local_1c + 0x7e;
      fVar6 = ABS((float)dVar5);
      uVar4 = local_1c + 0x7d;
      uVar3 = 0;
      local_1c = iVar1;
      if (uVar4 < 0xfe && 0.5 <= fVar6) {
        uVar3 = iVar1 * 0x800000 | (uint)((float)dVar5 < 0.0) << 0x1f |
                (int)(fVar6 * 16777216.0) & 0x7fffffU;
      }
    }
    fputc(uVar3 & 0xff,(FILE *)outputFile);
    fputc(uVar3 >> 8 & 0xff,(FILE *)outputFile);
    fputc(uVar3 >> 0x10 & 0xff,(FILE *)outputFile);
    uVar3 = uVar3 >> 0x18;
  }
  else {
    uVar2 = *(ushort *)((long)sampleBuffer + (long)sampleIx * 2);
    fputc((uint)(byte)uVar2,(FILE *)outputFile);
    uVar3 = (uint)(uVar2 >> 8);
  }
  fputc(uVar3,(FILE *)outputFile);
  return;
}

Assistant:

static inline void putSampleLE(void * const sampleBuffer, const int sampleIx, FILE *outputFile, const OUTPUT_SAMPLE_FORMAT outputSampleFormat) {
	if (outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
		MT32Emu::Bit32u sample = makeIeeeFloat(static_cast<float *>(sampleBuffer)[sampleIx]);
		fputc(sample & 0xFF, outputFile);
		fputc((sample >> 8) & 0xFF, outputFile);
		fputc((sample >> 16) & 0xFF, outputFile);
		fputc((sample >> 24) & 0xFF, outputFile);
	} else {
		MT32Emu::Bit16s sample = static_cast<MT32Emu::Bit16s *>(sampleBuffer)[sampleIx];
		fputc(sample & 0xFF, outputFile);
		fputc((sample >> 8) & 0xFF, outputFile);
	}
}